

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O1

exr_result_t update_chunk_offsets(exr_context_t ctxt,_internal_exr_seq_scratch *scratch)

{
  uint uVar1;
  exr_priv_part_t curpart;
  bool bVar2;
  exr_result_t eVar3;
  uint uVar4;
  char *pcVar5;
  ulong uVar6;
  exr_priv_part_t p_Var7;
  exr_priv_part_t p_Var8;
  exr_priv_part_t *pp_Var9;
  
  pp_Var9 = ctxt->parts;
  if (pp_Var9 == (exr_priv_part_t *)0x0) {
    return 3;
  }
  p_Var7 = *pp_Var9;
  p_Var7->chunk_table_offset = scratch->fileoff - scratch->navail;
  if (ctxt->num_parts < 1) {
    eVar3 = 0;
  }
  else {
    uVar6 = 0;
    do {
      curpart = ctxt->parts[uVar6];
      bVar2 = false;
      eVar3 = internal_exr_compute_tile_information(ctxt,curpart,0);
      p_Var8 = p_Var7;
      if (eVar3 == 0) {
        uVar4 = internal_exr_compute_chunk_offset_size(curpart);
        if ((int)uVar4 < 0) {
          pcVar5 = "<first>";
          if (curpart->name != (exr_attribute_t *)0x0) {
            pcVar5 = (char *)((curpart->name->field_6).chlist)->entries;
          }
          bVar2 = false;
          eVar3 = (*ctxt->print_error)
                            (ctxt,0xe,"Invalid chunk count (%d) for part \'%s\'",(ulong)uVar4,pcVar5
                            );
        }
        else {
          uVar1 = curpart->chunk_count;
          if ((int)uVar1 < 0) {
LAB_00128655:
            curpart->chunk_count = uVar4;
          }
          else if (uVar1 != uVar4) {
            pcVar5 = "<first>";
            if (curpart->name != (exr_attribute_t *)0x0) {
              pcVar5 = (char *)((curpart->name->field_6).chlist)->entries;
            }
            pp_Var9 = (exr_priv_part_t *)CONCAT44((int)((ulong)pp_Var9 >> 0x20),uVar4);
            (*ctxt->print_error)
                      (ctxt,0xe,"Invalid chunk count (%d) for part \'%s\' (%d), expect (%d)",
                       (ulong)uVar1,pcVar5,uVar6 & 0xffffffff,pp_Var9);
            goto LAB_00128655;
          }
          bVar2 = true;
          eVar3 = 0;
          p_Var8 = curpart;
          if (p_Var7 != curpart) {
            curpart->chunk_table_offset = (long)p_Var7->chunk_count * 8 + p_Var7->chunk_table_offset
            ;
          }
        }
      }
    } while ((bVar2) && (uVar6 = uVar6 + 1, p_Var7 = p_Var8, (long)uVar6 < (long)ctxt->num_parts));
  }
  return eVar3;
}

Assistant:

static exr_result_t
update_chunk_offsets (
    exr_context_t ctxt, struct _internal_exr_seq_scratch* scratch)
{
    exr_priv_part_t curpart, prevpart;

    exr_result_t rv = EXR_ERR_SUCCESS;

    if (!ctxt->parts) return EXR_ERR_INVALID_ARGUMENT;

    ctxt->parts[0]->chunk_table_offset =
        scratch->fileoff - (uint64_t) scratch->navail;
    prevpart = ctxt->parts[0];

    for (int p = 0; p < ctxt->num_parts; ++p)
    {
        int32_t ccount;

        curpart = ctxt->parts[p];

        rv = internal_exr_compute_tile_information (ctxt, curpart, 0);
        if (rv != EXR_ERR_SUCCESS) break;

        ccount = internal_exr_compute_chunk_offset_size (curpart);
        if (ccount < 0)
        {
            rv = ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ATTR,
                "Invalid chunk count (%d) for part '%s'",
                ccount,
                (curpart->name ? curpart->name->string->str : "<first>"));
            break;
        }

        if (curpart->chunk_count < 0)
            curpart->chunk_count = ccount;
        else if (curpart->chunk_count != ccount)
        {
            /* fatal error or just ignore it? c++ seemed to just ignore it entirely, we can at least warn */
            /* rv = */
            ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ATTR,
                "Invalid chunk count (%d) for part '%s' (%d), expect (%d)",
                curpart->chunk_count,
                (curpart->name ? curpart->name->string->str : "<first>"),
                p,
                ccount);
            curpart->chunk_count = ccount;
        }
        if (prevpart != curpart)
            curpart->chunk_table_offset =
                prevpart->chunk_table_offset +
                sizeof (uint64_t) * (size_t) (prevpart->chunk_count);
        prevpart = curpart;
    }
    return rv;
}